

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_NtkEliminate1(Abc_Ntk_t *pNtk,int ElimValue,int nMaxSize,int nIterMax,int fReverse,
                     int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  if (0 < nIterMax) {
    iVar3 = nIterMax + -1;
    iVar2 = pNtk->nObjCounts[7];
    do {
      iVar1 = Abc_NtkEliminate1One(pNtk,ElimValue,nMaxSize,fReverse,fVerbose);
      if (iVar1 == 0) {
        return 0;
      }
      bVar4 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while ((iVar2 != pNtk->nObjCounts[7]) && (iVar2 = pNtk->nObjCounts[7], bVar4));
  }
  return 1;
}

Assistant:

int Abc_NtkEliminate1( Abc_Ntk_t * pNtk, int ElimValue, int nMaxSize, int nIterMax, int fReverse, int fVerbose )
{
    int i;
    for ( i = 0; i < nIterMax; i++ )
    {
        int nNodes = Abc_NtkNodeNum(pNtk);
//        printf( "%d ", nNodes );
        if ( !Abc_NtkEliminate1One(pNtk, ElimValue, nMaxSize, fReverse, fVerbose) )
            return 0;
        if ( nNodes == Abc_NtkNodeNum(pNtk) )
            break;
    }
    return 1;
}